

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O0

wchar_t file_close(archive *a,void *client_data)

{
  int *in_RSI;
  write_file_data *mine;
  
  close(*in_RSI);
  archive_mstring_clean((archive_mstring *)0x28d29f);
  free(in_RSI);
  return L'\0';
}

Assistant:

static int
file_close(struct archive *a, void *data)
{
  struct mydata *mydata = (struct mydata *)data;
  if (mydata == NULL)
    return (ARCHIVE_FATAL);
  file_switch(a, mydata, NULL);
  free(mydata->filename);
  free(mydata);
  return (ARCHIVE_OK);
}